

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  FileDescriptor *file_00;
  string local_90;
  string name;
  string local_50;
  string local_30;
  
  FileClassPrefix_abi_cxx11_(&name,this,file);
  BaseFileName_abi_cxx11_(&local_30,this,file_00);
  StripProto(&local_50,&local_30);
  anon_unknown_0::UnderscoresToCamelCase(&local_90,&local_50,true);
  std::__cxx11::string::append((string *)&name);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"_RootClass",(allocator<char> *)&local_50);
  anon_unknown_0::SanitizeNameForObjC(__return_storage_ptr__,&name,&local_90,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const FileDescriptor* file) {
  string name = FileClassPrefix(file);
  name += UnderscoresToCamelCase(StripProto(BaseFileName(file)), true);
  name += "Root";
  // There aren't really any reserved words that end in "Root", but playing
  // it safe and checking.
  return SanitizeNameForObjC(name, "_RootClass", NULL);
}